

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

string * __thiscall
FloatInstance::representation_abi_cxx11_(string *__return_storage_ptr__,FloatInstance *this)

{
  int iVar1;
  Context *this_00;
  ostringstream oss;
  long local_190;
  long local_188 [2];
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xfffffefb | 4;
  this_00 = Context::get_instance();
  iVar1 = Context::get_float_precision(this_00);
  *(long *)((long)local_188 + *(long *)(local_190 + -0x18)) = (long)iVar1;
  std::ostream::operator<<(&local_190,this->_value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string FloatInstance::representation() const {
    std::ostringstream oss;
    oss << std::fixed << std::setprecision(Context::get_instance()->get_float_precision()) << _value;
    return oss.str();
}